

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# candidate_index_impl.h
# Opt level: O1

void __thiscall
candidate_index::CandidateIndex::lookup
          (CandidateIndex *this,
          vector<std::pair<int,_std::vector<label_set_converter::LabelSetElement,_std::allocator<label_set_converter::LabelSetElement>_>_>,_std::allocator<std::pair<int,_std::vector<label_set_converter::LabelSetElement,_std::allocator<label_set_converter::LabelSetElement>_>_>_>_>
          *sets_collection,
          vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *join_candidates,
          int number_of_labels,double distance_threshold)

{
  pointer pIVar1;
  int iVar2;
  pointer ppVar3;
  pointer ppVar4;
  int *piVar5;
  pointer pLVar6;
  long *plVar7;
  bool bVar8;
  int iVar9;
  int iVar10;
  ulong uVar11;
  ulong uVar12;
  long lVar13;
  int *piVar14;
  ulong uVar15;
  LabelSetElement *sv_r;
  CandidateIndex *pCVar16;
  long lVar17;
  long lVar18;
  pointer ppVar19;
  int *piVar20;
  CandidateIndex *pCVar21;
  long lVar22;
  double dVar23;
  int r_id;
  int set;
  int iStack_dc;
  vector<int,_std::allocator<int>_> M;
  vector<candidate_index::SetData,_std::allocator<candidate_index::SetData>_> set_data;
  vector<label_set_converter::LabelSetElement,_std::allocator<label_set_converter::LabelSetElement>_>
  r;
  vector<candidate_index::InvertedListElement,_std::allocator<candidate_index::InvertedListElement>_>
  il_index;
  
  std::
  vector<candidate_index::InvertedListElement,_std::allocator<candidate_index::InvertedListElement>_>
  ::vector(&il_index,(long)number_of_labels,(allocator_type *)&set_data);
  std::vector<candidate_index::SetData,_std::allocator<candidate_index::SetData>_>::vector
            (&set_data,
             (long)(sets_collection->
                   super__Vector_base<std::pair<int,_std::vector<label_set_converter::LabelSetElement,_std::allocator<label_set_converter::LabelSetElement>_>_>,_std::allocator<std::pair<int,_std::vector<label_set_converter::LabelSetElement,_std::allocator<label_set_converter::LabelSetElement>_>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish -
             (long)(sets_collection->
                   super__Vector_base<std::pair<int,_std::vector<label_set_converter::LabelSetElement,_std::allocator<label_set_converter::LabelSetElement>_>_>,_std::allocator<std::pair<int,_std::vector<label_set_converter::LabelSetElement,_std::allocator<label_set_converter::LabelSetElement>_>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start >> 5,(allocator_type *)&r);
  ppVar19 = (sets_collection->
            super__Vector_base<std::pair<int,_std::vector<label_set_converter::LabelSetElement,_std::allocator<label_set_converter::LabelSetElement>_>_>,_std::allocator<std::pair<int,_std::vector<label_set_converter::LabelSetElement,_std::allocator<label_set_converter::LabelSetElement>_>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  if (ppVar19 !=
      (sets_collection->
      super__Vector_base<std::pair<int,_std::vector<label_set_converter::LabelSetElement,_std::allocator<label_set_converter::LabelSetElement>_>_>,_std::allocator<std::pair<int,_std::vector<label_set_converter::LabelSetElement,_std::allocator<label_set_converter::LabelSetElement>_>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish) {
    do {
      std::
      vector<label_set_converter::LabelSetElement,_std::allocator<label_set_converter::LabelSetElement>_>
      ::vector(&r,&ppVar19->second);
      ppVar3 = (sets_collection->
               super__Vector_base<std::pair<int,_std::vector<label_set_converter::LabelSetElement,_std::allocator<label_set_converter::LabelSetElement>_>_>,_std::allocator<std::pair<int,_std::vector<label_set_converter::LabelSetElement,_std::allocator<label_set_converter::LabelSetElement>_>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      r_id = (int)((ulong)((long)ppVar19 - (long)ppVar3) >> 5);
      M.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
           (pointer)0x0;
      M.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
           (pointer)0x0;
      M.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      iVar2 = ppVar3[r_id].first;
      dVar23 = (double)iVar2;
      if ((dVar23 <= distance_threshold) &&
         (_set = (pair<int,_int>)((ulong)_set & 0xffffffff00000000), 0 < r_id)) {
        iVar9 = 0;
        do {
          if (set_data.
              super__Vector_base<candidate_index::SetData,_std::allocator<candidate_index::SetData>_>
              ._M_impl.super__Vector_impl_data._M_start[iVar9].overlap == 0) {
            if (M.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                _M_finish ==
                M.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                _M_end_of_storage) {
              std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                        ((vector<int,std::allocator<int>> *)&M,
                         (iterator)
                         M.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_finish,&set);
            }
            else {
              *M.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_finish = iVar9;
              M.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_finish = M.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_finish + 1;
            }
          }
          set_data.
          super__Vector_base<candidate_index::SetData,_std::allocator<candidate_index::SetData>_>.
          _M_impl.super__Vector_impl_data._M_start[set].overlap =
               set_data.
               super__Vector_base<candidate_index::SetData,_std::allocator<candidate_index::SetData>_>
               ._M_impl.super__Vector_impl_data._M_start[set].overlap + 1;
          iVar9 = set + 1;
          set = iVar9;
        } while (iVar9 < r_id);
      }
      dVar23 = dVar23 - distance_threshold;
      uVar11 = 0;
      do {
        uVar12 = uVar11;
        if ((ulong)(((long)r.
                           super__Vector_base<label_set_converter::LabelSetElement,_std::allocator<label_set_converter::LabelSetElement>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                     (long)r.
                           super__Vector_base<label_set_converter::LabelSetElement,_std::allocator<label_set_converter::LabelSetElement>_>
                           ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x3333333333333333) <=
            uVar11) break;
        iVar9 = r.
                super__Vector_base<label_set_converter::LabelSetElement,_std::allocator<label_set_converter::LabelSetElement>_>
                ._M_impl.super__Vector_impl_data._M_start[uVar11].id;
        pIVar1 = il_index.
                 super__Vector_base<candidate_index::InvertedListElement,_std::allocator<candidate_index::InvertedListElement>_>
                 ._M_impl.super__Vector_impl_data._M_start + iVar9;
        uVar12 = (ulong)il_index.
                        super__Vector_base<candidate_index::InvertedListElement,_std::allocator<candidate_index::InvertedListElement>_>
                        ._M_impl.super__Vector_impl_data._M_start[iVar9].offset;
        ppVar4 = il_index.
                 super__Vector_base<candidate_index::InvertedListElement,_std::allocator<candidate_index::InvertedListElement>_>
                 ._M_impl.super__Vector_impl_data._M_start[iVar9].element_list.
                 super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        uVar15 = (long)il_index.
                       super__Vector_base<candidate_index::InvertedListElement,_std::allocator<candidate_index::InvertedListElement>_>
                       ._M_impl.super__Vector_impl_data._M_start[iVar9].element_list.
                       super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish - (long)ppVar4 >> 3;
        if (uVar12 < uVar15) {
          ppVar3 = (sets_collection->
                   super__Vector_base<std::pair<int,_std::vector<label_set_converter::LabelSetElement,_std::allocator<label_set_converter::LabelSetElement>_>_>,_std::allocator<std::pair<int,_std::vector<label_set_converter::LabelSetElement,_std::allocator<label_set_converter::LabelSetElement>_>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          do {
            if (dVar23 <= (double)ppVar3[ppVar4[uVar12].first].first) break;
            pIVar1->offset = pIVar1->offset + 1;
            uVar12 = uVar12 + 1;
          } while (uVar15 != uVar12);
        }
        uVar12 = (ulong)pIVar1->offset;
        if (uVar12 < (ulong)((long)il_index.
                                   super__Vector_base<candidate_index::InvertedListElement,_std::allocator<candidate_index::InvertedListElement>_>
                                   ._M_impl.super__Vector_impl_data._M_start
                                   [r.
                                    super__Vector_base<label_set_converter::LabelSetElement,_std::allocator<label_set_converter::LabelSetElement>_>
                                    ._M_impl.super__Vector_impl_data._M_start[uVar11].id].
                                   element_list.
                                   super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)il_index.
                                   super__Vector_base<candidate_index::InvertedListElement,_std::allocator<candidate_index::InvertedListElement>_>
                                   ._M_impl.super__Vector_impl_data._M_start
                                   [r.
                                    super__Vector_base<label_set_converter::LabelSetElement,_std::allocator<label_set_converter::LabelSetElement>_>
                                    ._M_impl.super__Vector_impl_data._M_start[uVar11].id].
                                   element_list.
                                   super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start >> 3)) {
          sv_r = r.
                 super__Vector_base<label_set_converter::LabelSetElement,_std::allocator<label_set_converter::LabelSetElement>_>
                 ._M_impl.super__Vector_impl_data._M_start + uVar11;
          do {
            iVar9 = il_index.
                    super__Vector_base<candidate_index::InvertedListElement,_std::allocator<candidate_index::InvertedListElement>_>
                    ._M_impl.super__Vector_impl_data._M_start[sv_r->id].element_list.
                    super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                    _M_impl.super__Vector_impl_data._M_start[uVar12].first;
            set = iVar9;
            iVar10 = il_index.
                     super__Vector_base<candidate_index::InvertedListElement,_std::allocator<candidate_index::InvertedListElement>_>
                     ._M_impl.super__Vector_impl_data._M_start[sv_r->id].element_list.
                     super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                     _M_impl.super__Vector_impl_data._M_start[uVar12].second;
            this->il_lookups_ = this->il_lookups_ + 1;
            pCVar16 = (CandidateIndex *)((long)iVar9 * 0x20);
            iVar10 = structural_mapping(pCVar16,sv_r,
                                        (LabelSetElement *)
                                        ((long)iVar10 * 0x28 +
                                        *(long *)((long)&pCVar16->il_lookups_ +
                                                 (long)(sets_collection->
                                                                                                              
                                                  super__Vector_base<std::pair<int,_std::vector<label_set_converter::LabelSetElement,_std::allocator<label_set_converter::LabelSetElement>_>_>,_std::allocator<std::pair<int,_std::vector<label_set_converter::LabelSetElement,_std::allocator<label_set_converter::LabelSetElement>_>_>_>_>
                                                  )._M_impl.super__Vector_impl_data._M_start)),
                                        distance_threshold);
            if ((iVar10 != 0) &&
               (set_data.
                super__Vector_base<candidate_index::SetData,_std::allocator<candidate_index::SetData>_>
                ._M_impl.super__Vector_impl_data._M_start[iVar9].overlap == 0)) {
              if (M.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                  _M_finish ==
                  M.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                  _M_end_of_storage) {
                std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                          ((vector<int,std::allocator<int>> *)&M,
                           (iterator)
                           M.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_finish,&set);
              }
              else {
                *M.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                 _M_finish = iVar9;
                M.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                _M_finish = M.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_finish + 1;
              }
            }
            set_data.
            super__Vector_base<candidate_index::SetData,_std::allocator<candidate_index::SetData>_>.
            _M_impl.super__Vector_impl_data._M_start[set].overlap =
                 set_data.
                 super__Vector_base<candidate_index::SetData,_std::allocator<candidate_index::SetData>_>
                 ._M_impl.super__Vector_impl_data._M_start[set].overlap + iVar10;
            uVar12 = uVar12 + 1;
            sv_r = r.
                   super__Vector_base<label_set_converter::LabelSetElement,_std::allocator<label_set_converter::LabelSetElement>_>
                   ._M_impl.super__Vector_impl_data._M_start + uVar11;
          } while (uVar12 < (ulong)((long)il_index.
                                          super__Vector_base<candidate_index::InvertedListElement,_std::allocator<candidate_index::InvertedListElement>_>
                                          ._M_impl.super__Vector_impl_data._M_start[sv_r->id].
                                          element_list.
                                          super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                          ._M_impl.super__Vector_impl_data._M_finish -
                                    (long)il_index.
                                          super__Vector_base<candidate_index::InvertedListElement,_std::allocator<candidate_index::InvertedListElement>_>
                                          ._M_impl.super__Vector_impl_data._M_start[sv_r->id].
                                          element_list.
                                          super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start >> 3));
        }
        uVar12 = uVar11 + 1;
        pLVar6 = r.
                 super__Vector_base<label_set_converter::LabelSetElement,_std::allocator<label_set_converter::LabelSetElement>_>
                 ._M_impl.super__Vector_impl_data._M_start + uVar11;
        uVar11 = uVar12;
      } while ((double)pLVar6->weight_so_far <= distance_threshold + 1.0);
      set_data.
      super__Vector_base<candidate_index::SetData,_std::allocator<candidate_index::SetData>_>.
      _M_impl.super__Vector_impl_data._M_start[r_id].prefix = (int)uVar12;
      this->pre_candidates_ =
           this->pre_candidates_ +
           ((long)M.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                  _M_finish -
            (long)M.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                  _M_start >> 2);
      uVar11 = (ulong)r_id;
      piVar14 = M.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                _M_start;
      piVar5 = M.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_finish;
      if (0 < set_data.
              super__Vector_base<candidate_index::SetData,_std::allocator<candidate_index::SetData>_>
              ._M_impl.super__Vector_impl_data._M_start[uVar11].prefix) {
        lVar13 = 0;
        lVar17 = 0;
        lVar18 = 0;
        do {
          _set = (pair<int,_int>)((uVar11 & 0xffffffff) + lVar17);
          std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>::
          emplace_back<std::pair<int,int>>
                    ((vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *)
                     &il_index.
                      super__Vector_base<candidate_index::InvertedListElement,_std::allocator<candidate_index::InvertedListElement>_>
                      ._M_impl.super__Vector_impl_data._M_start
                      [*(int *)((long)&(r.
                                        super__Vector_base<label_set_converter::LabelSetElement,_std::allocator<label_set_converter::LabelSetElement>_>
                                        ._M_impl.super__Vector_impl_data._M_start)->id + lVar13)].
                      element_list,(pair<int,_int> *)&set);
          lVar18 = lVar18 + 1;
          uVar11 = (ulong)r_id;
          lVar17 = lVar17 + 0x100000000;
          lVar13 = lVar13 + 0x28;
          piVar14 = M.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                    _M_start;
          piVar5 = M.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                   _M_finish;
        } while (lVar18 < set_data.
                          super__Vector_base<candidate_index::SetData,_std::allocator<candidate_index::SetData>_>
                          ._M_impl.super__Vector_impl_data._M_start[uVar11].prefix);
      }
      for (; piVar14 != piVar5; piVar14 = piVar14 + 1) {
        iVar9 = *piVar14;
        set = iVar9;
        ppVar3 = (sets_collection->
                 super__Vector_base<std::pair<int,_std::vector<label_set_converter::LabelSetElement,_std::allocator<label_set_converter::LabelSetElement>_>_>,_std::allocator<std::pair<int,_std::vector<label_set_converter::LabelSetElement,_std::allocator<label_set_converter::LabelSetElement>_>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        lVar13 = (long)set_data.
                       super__Vector_base<candidate_index::SetData,_std::allocator<candidate_index::SetData>_>
                       ._M_impl.super__Vector_impl_data._M_start[r_id].prefix;
        lVar17 = (long)set_data.
                       super__Vector_base<candidate_index::SetData,_std::allocator<candidate_index::SetData>_>
                       ._M_impl.super__Vector_impl_data._M_start[iVar9].prefix;
        pCVar16 = *(CandidateIndex **)
                   &ppVar3[iVar9].second.
                    super__Vector_base<label_set_converter::LabelSetElement,_std::allocator<label_set_converter::LabelSetElement>_>
                    ._M_impl;
        if (*(int *)((long)pCVar16 + lVar17 * 0x28 + -0x28) <
            r.
            super__Vector_base<label_set_converter::LabelSetElement,_std::allocator<label_set_converter::LabelSetElement>_>
            ._M_impl.super__Vector_impl_data._M_start[lVar13 + -1].id) {
          lVar13 = 1;
          if ((r.
               super__Vector_base<label_set_converter::LabelSetElement,_std::allocator<label_set_converter::LabelSetElement>_>
               ._M_impl.super__Vector_impl_data._M_start)->weight_so_far <
              set_data.
              super__Vector_base<candidate_index::SetData,_std::allocator<candidate_index::SetData>_>
              ._M_impl.super__Vector_impl_data._M_start[iVar9].overlap) {
            lVar22 = ((long)r.
                            super__Vector_base<label_set_converter::LabelSetElement,_std::allocator<label_set_converter::LabelSetElement>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)r.
                            super__Vector_base<label_set_converter::LabelSetElement,_std::allocator<label_set_converter::LabelSetElement>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x3333333333333333;
            lVar18 = 0;
            piVar20 = &r.
                       super__Vector_base<label_set_converter::LabelSetElement,_std::allocator<label_set_converter::LabelSetElement>_>
                       ._M_impl.super__Vector_impl_data._M_start[1].weight_so_far;
            do {
              lVar13 = lVar22;
              if (lVar22 - lVar18 == 0) break;
              lVar13 = lVar18 + 1;
              iVar10 = *piVar20;
              lVar18 = lVar13;
              piVar20 = piVar20 + 10;
            } while (iVar10 < set_data.
                              super__Vector_base<candidate_index::SetData,_std::allocator<candidate_index::SetData>_>
                              ._M_impl.super__Vector_impl_data._M_start[iVar9].overlap);
            lVar13 = lVar13 + 1;
          }
        }
        else {
          lVar17 = 1;
          if ((int)pCVar16->il_lookups_ <
              set_data.
              super__Vector_base<candidate_index::SetData,_std::allocator<candidate_index::SetData>_>
              ._M_impl.super__Vector_impl_data._M_start[iVar9].overlap) {
            lVar22 = ((long)*(pointer *)
                             ((long)&ppVar3[iVar9].second.
                                     super__Vector_base<label_set_converter::LabelSetElement,_std::allocator<label_set_converter::LabelSetElement>_>
                                     ._M_impl + 8) - (long)pCVar16 >> 3) * -0x3333333333333333;
            lVar18 = 0;
            pCVar21 = pCVar16 + 3;
            do {
              lVar17 = lVar22;
              if (lVar22 - lVar18 == 0) break;
              lVar17 = lVar18 + 1;
              plVar7 = &pCVar21->pre_candidates_;
              lVar18 = lVar17;
              pCVar21 = (CandidateIndex *)&pCVar21[2].il_lookups_;
            } while ((int)*plVar7 <
                     set_data.
                     super__Vector_base<candidate_index::SetData,_std::allocator<candidate_index::SetData>_>
                     ._M_impl.super__Vector_impl_data._M_start[iVar9].overlap);
            lVar17 = lVar17 + 1;
          }
        }
        iVar10 = set_data.
                 super__Vector_base<candidate_index::SetData,_std::allocator<candidate_index::SetData>_>
                 ._M_impl.super__Vector_impl_data._M_start[iVar9].overlap;
        bVar8 = structural_filter(pCVar16,&r,&ppVar3[iVar9].second,dVar23,iVar10,(int)lVar13,
                                  (int)lVar17,(int)distance_threshold,
                                  (iVar2 - r.
                                           super__Vector_base<label_set_converter::LabelSetElement,_std::allocator<label_set_converter::LabelSetElement>_>
                                           ._M_impl.super__Vector_impl_data._M_start[lVar13 + -1].
                                           weight_so_far) + iVar10,
                                  (ppVar3[iVar9].first + iVar10) -
                                  *(int *)((long)pCVar16 + lVar17 * 0x28 + -0x20));
        if (bVar8) {
          std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>::
          emplace_back<int&,int&>
                    ((vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *)
                     join_candidates,&r_id,&set);
        }
        set_data.
        super__Vector_base<candidate_index::SetData,_std::allocator<candidate_index::SetData>_>.
        _M_impl.super__Vector_impl_data._M_start[set].overlap = 0;
      }
      if (M.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
          != (pointer)0x0) {
        operator_delete(M.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)M.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)M.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      std::
      vector<label_set_converter::LabelSetElement,_std::allocator<label_set_converter::LabelSetElement>_>
      ::~vector(&r);
      ppVar19 = ppVar19 + 1;
    } while (ppVar19 !=
             (sets_collection->
             super__Vector_base<std::pair<int,_std::vector<label_set_converter::LabelSetElement,_std::allocator<label_set_converter::LabelSetElement>_>_>,_std::allocator<std::pair<int,_std::vector<label_set_converter::LabelSetElement,_std::allocator<label_set_converter::LabelSetElement>_>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish);
  }
  if (set_data.
      super__Vector_base<candidate_index::SetData,_std::allocator<candidate_index::SetData>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(set_data.
                    super__Vector_base<candidate_index::SetData,_std::allocator<candidate_index::SetData>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)set_data.
                          super__Vector_base<candidate_index::SetData,_std::allocator<candidate_index::SetData>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)set_data.
                          super__Vector_base<candidate_index::SetData,_std::allocator<candidate_index::SetData>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  std::
  vector<candidate_index::InvertedListElement,_std::allocator<candidate_index::InvertedListElement>_>
  ::~vector(&il_index);
  return;
}

Assistant:

void CandidateIndex::lookup(
    std::vector<std::pair<int, std::vector<label_set_converter::LabelSetElement>>>& sets_collection,
    std::vector<std::pair<int, int>>& join_candidates,
    const int number_of_labels, 
    const double distance_threshold) {
  // inverted list index.
  std::vector<candidate_index::InvertedListElement> il_index(number_of_labels);
  // containing specific data of a set. (e.g. actual overlap, index prefix)
  std::vector<candidate_index::SetData> set_data(sets_collection.size());
  // position in label set while processing r
  std::size_t p = 0;

  // iterate through all sets in the given collection
  std::vector<std::pair<int, std::vector<label_set_converter::LabelSetElement>>>::iterator r_it = sets_collection.begin();
  for (; r_it != sets_collection.end(); ++r_it) {
    std::pair<int, std::vector<label_set_converter::LabelSetElement>>& r_pair = *r_it; // dereference iterator to current set once
    std::vector<label_set_converter::LabelSetElement> r = r_pair.second; // dereference iterator to current set once
    int r_id = r_it - sets_collection.begin(); // identifier for r (line number)
    std::vector<int> M; // holds the set identifiers of the candidate pairs, 
                                 // the overlap is stored in the set_data
    int r_size = sets_collection[r_id].first; // number of elements in r

    // *****************************
    // ** Generate pre candidates **
    // *****************************
    // add all small trees that does not have to share a common label in the prefix
    if(r_size <= distance_threshold) 
      for(int i = 0; i < r_id; ++i) {
        if(set_data[i].overlap == 0) 
          M.push_back(i); // if not, add it to the candidate set M
        ++set_data[i].overlap; // increase overlap for set i
      }

    // iterate through probing prefix elements and extend the candidate set
    p = 0;
    // until tau + 1 nodes of the probing set are processed
    while(p < r.size()) {
      // remove all entries in the inverted list index up to the position where 
      // the size is greater than the lower bound
      for(std::size_t s = il_index[r[p].id].offset; s < il_index[r[p].id].element_list.size() &&
          sets_collection[il_index[r[p].id].element_list[s].first].first < r_size - distance_threshold; s++)
        ++il_index[r[p].id].offset;

      // iterate through all remaining sets for the current token r[p] in the 
      // inverted list index and add them to the candidates
      for(std::size_t s = il_index[r[p].id].offset; s < il_index[r[p].id].element_list.size(); s++) {
        int set = il_index[r[p].id].element_list[s].first;
        int pos = il_index[r[p].id].element_list[s].second;
        // increase the number of lookups in the inverted list
        ++il_lookups_;

        int tau_valid = structural_mapping(r[p], sets_collection[set].second[pos], distance_threshold);
        if(tau_valid != 0 && set_data[set].overlap == 0) 
          M.push_back(set); // if not, add it to the candidate set M
        set_data[set].overlap += tau_valid;
        
      }
      // stop as soon as tau + 1 elements have been discovered
      p++;
      if(r[p-1].weight_so_far > distance_threshold + 1)
        break;
    }

    // store last postition of the index of the label set
    set_data[r_id].prefix = p;
    // count number of precandidates
    pre_candidates_ += M.size();
    
    // add all elements in the prefix of r in the inverted list
    for(int p = 0; p < set_data[r_id].prefix; p++)
      il_index[r[p].id].element_list.push_back(std::make_pair(r_id, p));

    // *****************************
    // *** Verify pre candidates ***
    // *****************************
    // compute structural filter for each candidate (r, s) in M
    for (int m: M) {
      std::vector<label_set_converter::LabelSetElement>& s = sets_collection[m].second;
      // prefix positions for sets r and s in the candidate pair
      std::size_t pr = 0, ps = 0;

      // check last prefix position; the smaller one starts at prefix position, 
      // the greater one starts at the overlap
      if (r[set_data[r_id].prefix-1].id > s[set_data[m].prefix-1].id) {
        for(; r[pr].weight_so_far < set_data[m].overlap && pr < r.size(); ++pr) {}
        ++pr;
        ps = set_data[m].prefix;
      } else {
        pr = set_data[r_id].prefix;
        for(; s[ps].weight_so_far < set_data[m].overlap && ps < s.size(); ++ps) {}
        ++ps;
      }

      int maxr = r_size - r[pr-1].weight_so_far + set_data[m].overlap;
      int maxs = sets_collection[m].first - s[ps-1].weight_so_far + set_data[m].overlap;

      // overlap needed for threshold tau between r and s
      const double eqoverlap = r_size - distance_threshold;

      // verify if r and s belong to the resultset, computed the structural filter
      if (structural_filter(r, s, eqoverlap, set_data[m].overlap, pr, ps, distance_threshold, maxr, maxs))
        join_candidates.emplace_back(r_id, m);

      // reset overlap in set_data
      set_data[m].overlap = 0;
    }
  }
}